

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.cpp
# Opt level: O0

void SplitString(string *input,char delim,
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *res)

{
  size_t this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88 [48];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58 [32];
  size_t local_38;
  size_t input_length;
  size_t pos2;
  size_t pos1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *res_local;
  string *psStack_10;
  char delim_local;
  string *input_local;
  
  pos1 = (size_t)res;
  res_local._7_1_ = delim;
  psStack_10 = input;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(res);
  local_38 = std::__cxx11::string::size();
  input_length = std::__cxx11::string::find((char)psStack_10,(ulong)(uint)(int)res_local._7_1_);
  pos2 = 0;
  while (this = pos1, input_length != 0xffffffffffffffff) {
    std::__cxx11::string::substr((ulong)local_58,(ulong)psStack_10);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this,local_58);
    std::__cxx11::string::~string((string *)local_58);
    pos2 = input_length + 1;
    input_length = std::__cxx11::string::find((char)psStack_10,(ulong)(uint)(int)res_local._7_1_);
  }
  if (pos2 != local_38) {
    std::__cxx11::string::substr((ulong)local_88,(ulong)psStack_10);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this,local_88);
    std::__cxx11::string::~string((string *)local_88);
  }
  return;
}

Assistant:

void SplitString(const string& input, char delim, vector<string>& res)
{
    res.clear();
    size_t pos1, pos2;
    size_t input_length = input.size();
    pos2 = input.find(delim);
    pos1 = 0;
    while (pos2 != string::npos)
    {
        res.emplace_back(input.substr(pos1, pos2 - pos1));
        pos1 = pos2 + 1;
        pos2 = input.find(delim, pos1);
    }
    if (pos1 != input_length)
    {
        res.emplace_back(input.substr(pos1));
    }
}